

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear(MessageGenerator *this,Printer *p)

{
  Options *pOVar1;
  pointer *pppFVar2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FieldDescriptor FVar3;
  FieldDescriptor FVar4;
  pointer ppFVar5;
  iterator __position;
  FieldChunk *pFVar6;
  FieldChunk *pFVar7;
  MessageGenerator *this_01;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined7 extraout_var;
  ChunkIterator CVar16;
  long *plVar17;
  FieldGenerator *pFVar18;
  string *psVar19;
  OneofDescriptor *pOVar20;
  Options *in_RCX;
  FieldChunk *pFVar21;
  string *psVar22;
  FieldDescriptor **field;
  pointer ppFVar23;
  FieldDescriptor *pFVar24;
  int iVar25;
  FieldGeneratorTable *pFVar26;
  FieldDescriptor *pFVar27;
  ChunkIterator it;
  ChunkIterator end;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  Hex hex;
  int cached_has_word_index;
  FieldDescriptor *field_1;
  Formatter format;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  chunks;
  string chunk_mask_str;
  int local_1f8;
  char local_1f2;
  bool local_1f1;
  MessageGenerator *local_1f0;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [40];
  Options *local_1a0;
  FieldGeneratorTable *local_198;
  Printer *local_190;
  undefined4 local_188;
  undefined4 local_184;
  string *local_180;
  FieldChunk *local_178;
  uint local_16c;
  string local_168;
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  local_148;
  Sub local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong local_50;
  FieldChunk *local_48;
  long local_40;
  code *local_38;
  ulong uVar15;
  
  pOVar1 = &this->options_;
  local_1f0 = this;
  local_190 = p;
  SimpleBaseClass_abi_cxx11_(&local_128.key_,(cpp *)this->descriptor_,(Descriptor *)pOVar1,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
    operator_delete(local_128.key_._M_dataplus._M_p,local_128.key_.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_128.key_._M_string_length == 0) {
    vars = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1c8 + 8);
    local_1c8._0_8_ = local_190;
    local_1c8._8_8_ = 0;
    local_1c8._16_8_ = 0;
    local_1c8._24_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
    format_00._M_str =
         "PROTOBUF_NOINLINE void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
    ;
    format_00._M_len = 0x6b;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (local_190,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),vars,format_00);
    *(long *)(local_1c8._0_8_ + 0x68) =
         *(long *)(local_1c8._0_8_ + 0x68) + *(long *)(local_1c8._0_8_ + 0x58);
    format_01._M_str = "$pbi$::TSanWrite(&_impl_);\n";
    format_01._M_len = 0x1b;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_1c8._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),vars,format_01);
    format_02._M_str =
         "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
    ;
    format_02._M_len = 0x77;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_1c8._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),vars,format_02);
    if (0 < *(int *)(local_1f0->descriptor_ + 0x88)) {
      format_03._M_str = "$extensions$.Clear();\n";
      format_03._M_len = 0x16;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_1c8._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),vars,format_03);
    }
    ppFVar23 = (local_1f0->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (local_1f0->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    iVar25 = 0;
    local_1a0 = pOVar1;
    if (ppFVar23 == ppFVar5) {
      local_184 = 0;
    }
    else {
      do {
        bVar8 = CanClearByZeroing(*ppFVar23);
        uVar15 = CONCAT71(extraout_var,bVar8);
        if (bVar8) {
          uVar11 = EstimateAlignmentSize(*ppFVar23);
          uVar15 = (ulong)uVar11;
          iVar25 = iVar25 + uVar11;
        }
        ppFVar23 = ppFVar23 + 1;
      } while (ppFVar23 != ppFVar5);
      local_184 = (undefined4)CONCAT71((int7)(uVar15 >> 8),4 < iVar25);
    }
    local_148.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_start = (FieldChunk *)0x0;
    local_148.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_finish = (FieldChunk *)0x0;
    local_148.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar22 = (string *)
              (local_1f0->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_180 = (string *)
                (local_1f0->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar22 != local_180) {
      local_198 = (FieldGeneratorTable *)0x0;
      do {
        this_01 = local_1f0;
        pFVar27 = (FieldDescriptor *)(psVar22->_M_dataplus)._M_p;
        local_1e8._0_8_ = pFVar27;
        if (local_148.
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_148.
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pFVar26 = (FieldGeneratorTable *)((ulong)local_198 & 0xffffffff);
LAB_00204ae5:
          uVar10 = google::protobuf::internal::cpp::HasHasbit((FieldDescriptor *)local_1e8._0_8_);
          pOVar1 = local_1a0;
          local_128.key_._M_dataplus._M_p._0_1_ = uVar10;
          bVar8 = IsRarelyPresent((FieldDescriptor *)local_1e8._0_8_,local_1a0);
          local_168._M_dataplus._M_p._0_1_ = bVar8;
          local_70._M_dataplus._M_p._0_1_ = ShouldSplit((FieldDescriptor *)local_1e8._0_8_,pOVar1);
          std::
          vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
          ::emplace_back<bool,bool,bool>
                    ((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>
                      *)&local_148,(bool *)&local_128,(bool *)&local_168,(bool *)&local_70);
          local_198 = pFVar26;
        }
        else {
          pFVar24 = local_148.
                    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1];
          iVar12 = HasBitIndex(local_1f0,pFVar24);
          iVar25 = iVar12 + 7;
          if (-1 < iVar12) {
            iVar25 = iVar12;
          }
          iVar25 = iVar25 >> 3;
          if (iVar12 == -1) {
            iVar25 = -1;
          }
          iVar13 = HasBitIndex(this_01,pFVar27);
          iVar12 = iVar13 + 7;
          if (-1 < iVar13) {
            iVar12 = iVar13;
          }
          iVar12 = iVar12 >> 3;
          if (iVar13 == -1) {
            iVar12 = -1;
          }
          pFVar26 = (FieldGeneratorTable *)0x0;
          if (iVar25 != iVar12) goto LAB_00204ae5;
          FVar3 = pFVar24[1];
          bVar8 = (bool)(((byte)FVar3 & 0x20) >> 5);
          if (0xbf < (byte)FVar3 == bVar8) {
            psVar19 = (string *)0x0;
          }
          else {
            psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar8,0xbf < (byte)FVar3,
                                 "is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar19 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_128,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
LAB_0020571c:
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_128);
          }
          FVar3 = pFVar24[1];
          FVar4 = pFVar27[1];
          bVar8 = (bool)(((byte)FVar4 & 0x20) >> 5);
          if (0xbf < (byte)FVar4 == bVar8) {
            psVar19 = (string *)0x0;
          }
          else {
            psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar8,0xbf < (byte)FVar4,
                                 "is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar19 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_128,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
            goto LAB_0020571c;
          }
          if ((((byte)FVar3 ^ (byte)pFVar27[1]) & 0x20) != 0) goto LAB_00204ae5;
          bVar8 = IsLikelyPresent(pFVar24,local_1a0);
          bVar9 = IsLikelyPresent(pFVar27,local_1a0);
          if (bVar8 != bVar9) goto LAB_00204ae5;
          bVar8 = ShouldSplit(pFVar24,local_1a0);
          bVar9 = ShouldSplit(pFVar27,local_1a0);
          pFVar26 = (FieldGeneratorTable *)0x0;
          if (bVar8 != bVar9) goto LAB_00204ae5;
          bVar8 = CanClearByZeroing(pFVar24);
          bVar9 = CanClearByZeroing(pFVar27);
          uVar11 = (int)local_198 + 1;
          if (bVar8 == bVar9) {
            local_198 = (FieldGeneratorTable *)(ulong)uVar11;
          }
          else {
            bVar8 = CanClearByZeroing(pFVar24);
            bVar9 = (int)local_198 == 0;
            local_198 = (FieldGeneratorTable *)(ulong)uVar11;
            if ((bVar8 & (bVar9 | (byte)local_184)) == 0) goto LAB_00204ae5;
          }
        }
        __position._M_current =
             local_148.
             super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            local_148.
            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&local_148.
                         super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].fields,__position,
                     (FieldDescriptor **)local_1e8);
        }
        else {
          *__position._M_current = (FieldDescriptor *)local_1e8._0_8_;
          pppFVar2 = &local_148.
                      super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar2 = *pppFVar2 + 1;
        }
        psVar22 = (string *)&psVar22->_M_string_length;
      } while (psVar22 != local_180);
    }
    local_1f8 = -1;
    local_178 = local_148.
                super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_148.
        super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_148.
        super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_180 = (string *)&local_1f0->has_bit_indices_;
      local_198 = &local_1f0->field_generators_;
      CVar16._M_current =
           local_148.
           super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pFVar6 = local_148.
               super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
               ._M_impl.super__Vector_impl_data._M_start;
      it._M_current =
           local_148.
           super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
LAB_00204c1f:
      do {
        iVar25 = local_1f8;
        pFVar21 = pFVar6 + 1;
        end._M_current = local_178;
        if (((pFVar21 != local_178) &&
            (end._M_current = CVar16._M_current + 1,
            (it._M_current)->has_hasbit == pFVar21->has_hasbit)) &&
           ((it._M_current)->is_rarely_present == pFVar6[1].is_rarely_present)) {
          pFVar7 = pFVar6 + 1;
          CVar16._M_current = end._M_current;
          end._M_current = pFVar21;
          pFVar6 = pFVar21;
          if ((it._M_current)->should_split == pFVar7->should_split) goto LAB_00204c1f;
        }
        local_128.key_._M_dataplus._M_p = (pointer)&local_128.key_.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
        psVar22 = local_180;
        local_1f2 = anon_unknown_0::MaybeEmitHaswordsCheck
                              (it,end,local_1a0,(vector<int,_std::allocator<int>_> *)local_180,
                               iVar25,&local_128.key_,local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
          operator_delete(local_128.key_._M_dataplus._M_p,
                          local_128.key_.field_2._M_allocated_capacity + 1);
        }
        ppFVar23 = ((it._M_current)->fields).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppFVar23 ==
            ((it._M_current)->fields).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_188 = 0;
        }
        else {
          local_188 = (undefined4)
                      CONCAT71((int7)((ulong)ppFVar23 >> 8),(it._M_current)->should_split);
          if ((it._M_current)->should_split == true) {
            format_04._M_str = "if (!IsSplitMessageDefault()) {\n";
            format_04._M_len = 0x20;
            io::Printer::
            FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                      ((Printer *)local_1c8._0_8_,
                       (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )ZEXT816(0),
                       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_1c8 + 8),format_04);
            psVar22 = *(string **)(local_1c8._0_8_ + 0x58);
            *(long *)(local_1c8._0_8_ + 0x68) =
                 (long)&(psVar22->_M_dataplus)._M_p + *(long *)(local_1c8._0_8_ + 0x68);
          }
        }
        CVar16._M_current = it._M_current;
        if (it._M_current != end._M_current) {
          do {
            local_48 = end._M_current;
            bVar8 = (it._M_current)->should_split;
            if ((bool)(char)local_188 == bVar8) {
              psVar19 = (string *)0x0;
            }
            else {
              psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                  ((bool)(char)local_188,bVar8,
                                   "has_default_split_check == chunk_is_split");
            }
            local_1f1 = bVar8;
            if (psVar19 != (string *)0x0) {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_128,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                         ,0xdb2,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
              goto LAB_0020571c;
            }
            ppFVar23 = ((it._M_current)->fields).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppFVar5 = ((it._M_current)->fields).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppFVar23 == ppFVar5) {
              pFVar27 = (FieldDescriptor *)0x0;
              pFVar24 = (FieldDescriptor *)0x0;
            }
            else {
              pFVar24 = (FieldDescriptor *)0x0;
              pFVar27 = (FieldDescriptor *)0x0;
              bVar8 = false;
              do {
                bVar9 = CanClearByZeroing(*ppFVar23);
                if (bVar9) {
                  if (bVar8) {
                    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&local_128,
                               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                               ,0xdba,0x12,"!saw_non_zero_init");
                    goto LAB_0020571c;
                  }
                  pFVar27 = *ppFVar23;
                  if (pFVar24 == (FieldDescriptor *)0x0) {
                    pFVar24 = pFVar27;
                  }
                }
                else {
                  bVar8 = true;
                }
                ppFVar23 = ppFVar23 + 1;
              } while (ppFVar23 != ppFVar5);
            }
            fields = &(it._M_current)->fields;
            ppFVar23 = (fields->
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            iVar25 = HasBitIndex(local_1f0,*ppFVar23);
            if (iVar25 == -1) {
LAB_00204de9:
              uVar15 = 0;
            }
            else {
              ppFVar5 = ((it._M_current)->fields).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              psVar22 = (string *)((long)ppFVar5 - (long)ppFVar23);
              if ((psVar22 < (string *)0x9) ||
                 (bVar8 = IsLikelyPresent(ppFVar5[-1],local_1a0), bVar8)) goto LAB_00204de9;
              ppFVar23 = ((it._M_current)->fields).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              uVar15 = CONCAT71((int7)((ulong)ppFVar23 >> 8),
                                pFVar27 != ppFVar23[-1] | (byte)local_184);
            }
            local_16c = (uint)uVar15;
            if ((uVar15 & 1) != 0) {
              uVar11 = anon_unknown_0::GenChunkMask
                                 (fields,(vector<int,_std::allocator<int>_> *)local_180);
              hex.value = local_50 & 0xffffffffffff0000 | 0x3008;
              local_1d8._8_8_ = 0;
              local_1e8._0_8_ = local_1e8 + 0x10;
              local_1e8._8_8_ = (Descriptor *)0x0;
              local_1d8._M_allocated_capacity = 0;
              hex._8_8_ = psVar22;
              local_50 = hex.value;
              absl::lts_20240722::AbslStringify<absl::lts_20240722::strings_internal::StringifySink>
                        ((lts_20240722 *)local_1e8,(StringifySink *)(ulong)uVar11,hex);
              local_128.key_._M_dataplus._M_p = (pointer)&local_128.key_.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,local_1e8._0_8_,
                         (Descriptor *)(local_1e8._8_8_ + local_1e8._0_8_));
              if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
              }
              iVar25 = 0;
              uVar14 = uVar11;
              if (uVar11 != 0) {
                do {
                  iVar25 = iVar25 + (uVar14 & 1);
                  bVar8 = 1 < uVar14;
                  uVar14 = uVar14 >> 1;
                } while (bVar8);
              }
              if (iVar25 < 2) {
                psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                    (2,(long)iVar25,"2 <= popcnt(chunk_mask)");
              }
              else {
                psVar19 = (string *)0x0;
              }
              if (psVar19 != (string *)0x0) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                           ,0xdd5,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
LAB_00205787:
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)local_1e8);
              }
              uVar14 = 0;
              if (uVar11 != 0) {
                do {
                  uVar14 = uVar14 + (uVar11 & 1);
                  bVar8 = 1 < uVar11;
                  uVar11 = uVar11 >> 1;
                } while (bVar8);
              }
              if ((int)uVar14 < 9) {
                psVar19 = (string *)0x0;
              }
              else {
                psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                    (8,(ulong)uVar14,"8 >= popcnt(chunk_mask)");
              }
              iVar25 = local_1f8;
              if (psVar19 != (string *)0x0) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                           ,0xdd6,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                goto LAB_00205787;
              }
              iVar13 = HasBitIndex(local_1f0,
                                   *(fields->
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
              iVar12 = iVar13 + 0x1f;
              if (-1 < iVar13) {
                iVar12 = iVar13;
              }
              iVar12 = iVar12 >> 5;
              if (iVar13 == -1) {
                iVar12 = -1;
              }
              if (iVar25 != iVar12) {
                local_1f8 = iVar12;
                Formatter::operator()
                          ((Formatter *)local_1c8,"cached_has_bits = $has_bits$[$1$];\n",&local_1f8)
                ;
              }
              Formatter::operator()
                        ((Formatter *)local_1c8,"if (cached_has_bits & 0x$1$u) {\n",&local_128.key_)
              ;
              psVar22 = *(string **)(local_1c8._0_8_ + 0x58);
              *(long *)(local_1c8._0_8_ + 0x68) =
                   (long)&(psVar22->_M_dataplus)._M_p + *(long *)(local_1c8._0_8_ + 0x68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
                operator_delete(local_128.key_._M_dataplus._M_p,
                                local_128.key_.field_2._M_allocated_capacity + 1);
              }
            }
            if (pFVar24 != (FieldDescriptor *)0x0) {
              if (pFVar24 == pFVar27) {
                pFVar18 = FieldGeneratorTable::get(local_198,pFVar24);
                FieldGenerator::GenerateMessageClearingCode(pFVar18,local_190);
              }
              else {
                bVar9 = ShouldSplit(pFVar24,local_1a0);
                bVar8 = local_1f1;
                uVar10 = SUB81(psVar22,0);
                if (local_1f1 == bVar9) {
                  psVar19 = (string *)0x0;
                }
                else {
                  psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                      (local_1f1,bVar9,
                                       "chunk_is_split == ShouldSplit(memset_start, options_)");
                }
                if (psVar19 != (string *)0x0) {
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_128,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                             ,0xde5,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                  goto LAB_0020571c;
                }
                bVar9 = ShouldSplit(pFVar27,local_1a0);
                if (bVar8 == bVar9) {
                  psVar19 = (string *)0x0;
                }
                else {
                  psVar19 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                      (bVar8,bVar9,
                                       "chunk_is_split == ShouldSplit(memset_end, options_)");
                }
                if (psVar19 != (string *)0x0) {
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&local_128,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                             ,0xde6,*(undefined8 *)(psVar19 + 8),*(undefined8 *)psVar19);
                  goto LAB_0020571c;
                }
                FieldMemberName_abi_cxx11_
                          (&local_128.key_,(cpp *)pFVar24,(FieldDescriptor *)(ulong)bVar8,
                           (bool)uVar10);
                psVar22 = (string *)local_1e8;
                FieldMemberName_abi_cxx11_
                          (psVar22,(cpp *)pFVar27,(FieldDescriptor *)(ulong)bVar8,(bool)uVar10);
                Formatter::operator()
                          ((Formatter *)local_1c8,
                           "::memset(&$1$, 0, static_cast<::size_t>(\n    reinterpret_cast<char*>(&$2$) -\n    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n"
                           ,&local_128.key_,psVar22);
                if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
                  operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
                  operator_delete(local_128.key_._M_dataplus._M_p,
                                  local_128.key_.field_2._M_allocated_capacity + 1);
                }
              }
            }
            ppFVar5 = ((it._M_current)->fields).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (ppFVar23 = ((it._M_current)->fields).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; ppFVar23 != ppFVar5;
                ppFVar23 = ppFVar23 + 1) {
              bVar8 = CanClearByZeroing(*ppFVar23);
              if (!bVar8) {
                pFVar27 = *ppFVar23;
                iVar25 = HasBitIndex(local_1f0,pFVar27);
                if (iVar25 == -1) {
                  bVar8 = false;
                }
                else {
                  psVar22 = (string *)&FieldDescriptor::kTypeToCppTypeMap;
                  bVar8 = *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                                  (ulong)(byte)pFVar27[2] * 4) - 9U < 2;
                }
                if (bVar8) {
                  if (*(char *)(*(long *)(pFVar27 + 0x38) + 0x8c) == '\0') {
                    if (((byte)pFVar27[1] & 8) == 0) {
                      plVar17 = (long *)(*(long *)(pFVar27 + 0x20) + 0x38);
                    }
                    else if (*(long *)(pFVar27 + 0x28) == 0) {
                      plVar17 = (long *)(*(long *)(pFVar27 + 0x10) + 0x78);
                    }
                    else {
                      plVar17 = (long *)(*(long *)(pFVar27 + 0x28) + 0x60);
                    }
                    iVar25 = *(int *)((local_180->_M_dataplus)._M_p +
                                     (long)((int)((ulong)((long)pFVar27 - *plVar17) >> 3) *
                                           -0x45d1745d) * 4);
                    iVar12 = iVar25 + 0x1f;
                    if (-1 < iVar25) {
                      iVar12 = iVar25;
                    }
                    if (local_1f8 != iVar12 >> 5) {
                      local_1e8._0_8_ = local_1e8 + 0x10;
                      local_1e8._8_8_ = &DAT_00000005;
                      local_1d8._M_allocated_capacity._0_6_ = 0x7865646e69;
                      local_1f8 = iVar12 >> 5;
                      io::Printer::Sub::Sub<int&>(&local_128,(string *)local_1e8,&local_1f8);
                      google::protobuf::io::Printer::Emit
                                (local_190,&local_128,1,0x46,
                                 "\n                cached_has_bits = $has_bits$[$index$];\n              "
                                );
                      if (local_128.annotation_.
                          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                          ._M_payload.
                          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                          .
                          super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                          ._M_engaged == true) {
                        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                        ::_M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                      *)&local_128.annotation_);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_128.value_.consume_after._M_dataplus._M_p !=
                          &local_128.value_.consume_after.field_2) {
                        operator_delete(local_128.value_.consume_after._M_dataplus._M_p,
                                        local_128.value_.consume_after.field_2._M_allocated_capacity
                                        + 1);
                      }
                      (*std::__detail::__variant::
                        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                        ::_S_vtable._M_arr
                        [local_128.value_.value.
                         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                         .
                         super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         .
                         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                         ._M_index]._M_data)
                                ((anon_class_1_0_00000001 *)&local_70,&local_128.value_.value);
                      local_128.value_.value.
                      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                      .
                      super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      .
                      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                      ._M_index = 0xff;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
                        operator_delete(local_128.key_._M_dataplus._M_p,
                                        local_128.key_.field_2._M_allocated_capacity + 1);
                      }
                      if ((FieldDescriptor *)local_1e8._0_8_ !=
                          (FieldDescriptor *)(local_1e8 + 0x10)) {
                        operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1)
                        ;
                      }
                    }
                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                    local_168.field_2._M_allocated_capacity._0_4_ = 0x6b73616d;
                    local_40 = 1L << ((byte)iVar25 & 0x1f);
                    local_168._M_string_length = 4;
                    local_168.field_2._M_allocated_capacity._4_4_ =
                         local_168.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                    local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                               Dispatch<unsigned_int>;
                    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                              (&local_70,"0x%08xu",7,&local_40,1);
                    io::Printer::Sub::Sub<std::__cxx11::string>(&local_128,&local_168,&local_70);
                    google::protobuf::io::Printer::Emit
                              (local_190,&local_128,1,0x3b,
                               "\n              if (cached_has_bits & $mask$) {\n            ");
                    if (local_128.annotation_.
                        super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                        ._M_payload.
                        super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                        .
                        super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                        ._M_engaged == true) {
                      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                      _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                                  *)&local_128.annotation_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128.value_.consume_after._M_dataplus._M_p !=
                        &local_128.value_.consume_after.field_2) {
                      operator_delete(local_128.value_.consume_after._M_dataplus._M_p,
                                      local_128.value_.consume_after.field_2._M_allocated_capacity +
                                      1);
                    }
                    (*std::__detail::__variant::
                      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                      ::_S_vtable._M_arr
                      [local_128.value_.value.
                       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                       .
                       super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       .
                       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       .
                       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       .
                       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       .
                       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       ._M_index]._M_data)
                              ((anon_class_1_0_00000001 *)&local_40,&local_128.value_.value);
                    local_128.value_.value.
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    .
                    super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    ._M_index = 0xff;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128.key_._M_dataplus._M_p != &local_128.key_.field_2) {
                      operator_delete(local_128.key_._M_dataplus._M_p,
                                      local_128.key_.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_)
                        != &local_70.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                               local_70._M_dataplus._M_p._0_1_),
                                      local_70.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      CONCAT44(local_168.field_2._M_allocated_capacity._4_4_,
                                               local_168.field_2._M_allocated_capacity._0_4_) + 1);
                    }
                  }
                  else {
                    google::protobuf::io::Printer::Emit
                              (local_190,0,0,0x1f,"\n      if (has_$name$()) {\n    ");
                  }
                  psVar22 = *(string **)(local_1c8._0_8_ + 0x58);
                  *(long *)(local_1c8._0_8_ + 0x68) =
                       (long)&(psVar22->_M_dataplus)._M_p + *(long *)(local_1c8._0_8_ + 0x68);
                }
                pFVar18 = FieldGeneratorTable::get(local_198,*ppFVar23);
                FieldGenerator::GenerateMessageClearingCode(pFVar18,local_190);
                if (bVar8) {
                  google::protobuf::io::Printer::Outdent();
                  psVar22 = (string *)(local_1c8 + 8);
                  format_05._M_str = "}\n";
                  format_05._M_len = 2;
                  io::Printer::
                  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                            ((Printer *)local_1c8._0_8_,
                             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )ZEXT816(0),
                             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)psVar22,format_05);
                }
              }
            }
            if ((local_16c & 1) != 0) {
              google::protobuf::io::Printer::Outdent();
              psVar22 = (string *)(local_1c8 + 8);
              format_06._M_str = "}\n";
              format_06._M_len = 2;
              io::Printer::
              FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                        ((Printer *)local_1c8._0_8_,
                         (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0),
                         (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)psVar22,format_06);
            }
            it._M_current = it._M_current + 1;
            CVar16._M_current = it._M_current;
            end._M_current = local_48;
          } while (it._M_current != local_48);
        }
        if ((char)local_188 != '\0') {
          google::protobuf::io::Printer::Outdent();
          format_07._M_str = "}\n";
          format_07._M_len = 2;
          io::Printer::
          FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    ((Printer *)local_1c8._0_8_,
                     (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),
                     (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_1c8 + 8),format_07);
        }
        if (local_1f2 != '\0') {
          google::protobuf::io::Printer::Outdent();
          google::protobuf::io::Printer::Emit(local_190,0,0,0x11,"\n        }\n      ");
          local_1f8 = -1;
        }
        pFVar6 = CVar16._M_current;
        it._M_current = CVar16._M_current;
      } while (CVar16._M_current != local_178);
    }
    local_1e8._8_8_ = local_1f0->descriptor_;
    local_128.key_._M_dataplus._M_p._0_4_ = 0;
    local_1e8._0_4_ = *(undefined4 *)(local_1e8._8_8_ + 0x7c);
    local_128.key_._M_string_length = local_1e8._8_8_;
    while (bVar8 = cpp::operator==((Iterator *)&local_128,(Iterator *)local_1e8), !bVar8) {
      pOVar20 = Descriptor::oneof_decl
                          ((Descriptor *)local_128.key_._M_string_length,
                           (int)local_128.key_._M_dataplus._M_p);
      Formatter::operator()
                ((Formatter *)local_1c8,"clear_$1$();\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pOVar20 + 8));
      local_128.key_._M_dataplus._M_p._0_4_ = (int)local_128.key_._M_dataplus._M_p + 1;
    }
    this_00 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_1c8 + 8);
    if (local_1f0->num_weak_fields_ != 0) {
      format_08._M_str = "$weak_field_map$.ClearAll();\n";
      format_08._M_len = 0x1d;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_1c8._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,format_08);
    }
    if ((local_1f0->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (local_1f0->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      format_09._M_str = "$has_bits$.Clear();\n";
      format_09._M_len = 0x14;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_1c8._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,format_09);
    }
    format_10._M_str = "_internal_metadata_.Clear<$unknown_fields_type$>();\n";
    format_10._M_len = 0x34;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_1c8._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_00,format_10);
    google::protobuf::io::Printer::Outdent();
    format_11._M_str = "}\n";
    format_11._M_len = 2;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_1c8._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_00,format_11);
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ::~vector(&local_148);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set(this_00);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(p);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "PROTOBUF_NOINLINE void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format("$pbi$::TSanWrite(&_impl_);\n");

  format(
      // TODO: It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("$extensions$.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanClearByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same =
            HasByteIndex(a) == HasByteIndex(b) &&
            a->is_repeated() == b->is_repeated() &&
            IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
            ShouldSplit(a, options_) == ShouldSplit(b, options_) &&
            (CanClearByZeroing(a) == CanClearByZeroing(b) ||
             (CanClearByZeroing(a) && (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check = MaybeEmitHaswordsCheck(
        it, next, options_, has_bit_indices_, cached_has_word_index, "", p);
    bool has_default_split_check = !it->fields.empty() && it->should_split;
    if (has_default_split_check) {
      // Some fields are cleared without checking has_bit. So we add the
      // condition here to avoid writing to the default split instance.
      format("if (!IsSplitMessageDefault()) {\n");
      format.Indent();
    }
    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      bool chunk_is_split = it->should_split;
      ABSL_CHECK_EQ(has_default_split_check, chunk_is_split);

      const FieldDescriptor* memset_start = nullptr;
      const FieldDescriptor* memset_end = nullptr;
      bool saw_non_zero_init = false;

      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) {
          ABSL_CHECK(!saw_non_zero_init);
          if (!memset_start) memset_start = field;
          memset_end = field;
        } else {
          saw_non_zero_init = true;
        }
      }

      // Whether we wrap this chunk in:
      //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
      // We can omit the if() for chunk size 1, or if our fields do not have
      // hasbits. I don't understand the rationale for the last part of the
      // condition, but it matches the old logic.
      const bool check_has_byte =
          HasBitIndex(fields.front()) != kNoHasbit && fields.size() > 1 &&
          !IsLikelyPresent(fields.back(), options_) &&
          (memset_end != fields.back() || merge_zero_init);

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);
        std::string chunk_mask_str =
            absl::StrCat(absl::Hex(chunk_mask, absl::kZeroPad8));

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        if (cached_has_word_index != HasWordIndex(fields.front())) {
          cached_has_word_index = HasWordIndex(fields.front());
          format("cached_has_bits = $has_bits$[$1$];\n", cached_has_word_index);
        }
        format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
        format.Indent();
      }

      if (memset_start) {
        if (memset_start == memset_end) {
          // For clarity, do not memset a single field.
          field_generators_.get(memset_start).GenerateMessageClearingCode(p);
        } else {
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_start, options_));
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_end, options_));
          format(
              "::memset(&$1$, 0, static_cast<::size_t>(\n"
              "    reinterpret_cast<char*>(&$2$) -\n"
              "    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n",
              FieldMemberName(memset_start, chunk_is_split),
              FieldMemberName(memset_end, chunk_is_split));
        }
      }

      // Clear all non-zero-initializable fields in the chunk.
      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) continue;
        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO:  Let the CppFieldGenerator decide this somehow.
        bool have_enclosing_if =
            HasBitIndex(field) != kNoHasbit &&
            (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
             field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

        if (have_enclosing_if) {
          PrintPresenceCheck(field, has_bit_indices_, p,
                             &cached_has_word_index);
          format.Indent();
        }

        field_generators_.get(field).GenerateMessageClearingCode(p);

        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_default_split_check) {
      format.Outdent();
      format("}\n");
    }
    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }
  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("$weak_field_map$.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("$has_bits$.Clear();\n");
  }

  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}